

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushFont(ImFont *font)

{
  int iVar1;
  ImFont **ppIVar2;
  ImGuiContext *pIVar3;
  ImFont **__dest;
  int iVar4;
  int iVar5;
  
  pIVar3 = GImGui;
  if (font == (ImFont *)0x0) {
    font = GetDefaultFont();
  }
  SetCurrentFont(font);
  iVar5 = (pIVar3->FontStack).Size;
  iVar1 = (pIVar3->FontStack).Capacity;
  if (iVar5 == iVar1) {
    iVar5 = iVar5 + 1;
    if (iVar1 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar1 / 2 + iVar1;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar1 < iVar5) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __dest = (ImFont **)(*GImAllocatorAllocFunc)((long)iVar5 << 3,GImAllocatorUserData);
      ppIVar2 = (pIVar3->FontStack).Data;
      if (ppIVar2 != (ImFont **)0x0) {
        memcpy(__dest,ppIVar2,(long)(pIVar3->FontStack).Size << 3);
        ppIVar2 = (pIVar3->FontStack).Data;
        if (ppIVar2 != (ImFont **)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(ppIVar2,GImAllocatorUserData);
      }
      (pIVar3->FontStack).Data = __dest;
      (pIVar3->FontStack).Capacity = iVar5;
    }
  }
  (pIVar3->FontStack).Data[(pIVar3->FontStack).Size] = font;
  (pIVar3->FontStack).Size = (pIVar3->FontStack).Size + 1;
  ImDrawList::PushTextureID(pIVar3->CurrentWindow->DrawList,font->ContainerAtlas->TexID);
  return;
}

Assistant:

void ImGui::PushFont(ImFont* font)
{
    ImGuiContext& g = *GImGui;
    if (!font)
        font = GetDefaultFont();
    SetCurrentFont(font);
    g.FontStack.push_back(font);
    g.CurrentWindow->DrawList->PushTextureID(font->ContainerAtlas->TexID);
}